

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_editor.c
# Opt level: O0

void canvas_mouseup(_glist *x,t_floatarg fxpos,t_floatarg fypos,t_floatarg fwhich,t_floatarg fmod)

{
  int iVar1;
  int ypos_00;
  double dVar2;
  _glist *gl2;
  t_gobj *g;
  int mod;
  int which;
  int ypos;
  int xpos;
  t_floatarg fmod_local;
  t_floatarg fwhich_local;
  t_floatarg fypos_local;
  t_floatarg fxpos_local;
  _glist *x_local;
  
  iVar1 = (int)fxpos;
  ypos_00 = (int)fypos;
  if (x->gl_editor == (t_editor *)0x0) {
    bug("editor");
  }
  else {
    dVar2 = sys_getrealtime();
    *(double *)((pd_maininstance.pd_gui)->i_editor + 0x48) = dVar2;
    *(int *)((pd_maininstance.pd_gui)->i_editor + 0x50) = iVar1;
    *(int *)((pd_maininstance.pd_gui)->i_editor + 0x54) = ypos_00;
    if ((x->gl_editor->field_0x88 & 7) == 2) {
      canvas_doconnect(x,iVar1,ypos_00,(int)fmod,1);
    }
    else if ((x->gl_editor->field_0x88 & 7) == 3) {
      canvas_doregion(x,iVar1,ypos_00,1);
    }
    else if (((x->gl_editor->field_0x88 & 7) == 1) || ((x->gl_editor->field_0x88 & 7) == 6)) {
      if ((x->gl_editor->e_selection != (t_selection *)0x0) &&
         (x->gl_editor->e_selection->sel_next == (_selection *)0x0)) {
        iVar1 = canvas_undo_confirmdiscard(x->gl_editor->e_selection->sel_what);
        if (iVar1 != 0) {
          return;
        }
        gobj_activate(x->gl_editor->e_selection->sel_what,x,1);
      }
    }
    else if ((x->gl_editor->field_0x88 & 7) == 4) {
      if (x->gl_editor->e_motionfn == (t_glistmotionfn)0x0) {
        bug("e_motionfn");
      }
      (*x->gl_editor->e_motionfn)
                (x->gl_editor->e_grab,(float)(iVar1 - x->gl_editor->e_xwas),
                 (float)(ypos_00 - x->gl_editor->e_ywas),1.0);
    }
    x->gl_editor->field_0x88 = x->gl_editor->field_0x88 & 0xf8;
  }
  return;
}

Assistant:

void canvas_mouseup(t_canvas *x,
    t_floatarg fxpos, t_floatarg fypos, t_floatarg fwhich,
    t_floatarg fmod)
{
    int xpos = fxpos, ypos = fypos, which = fwhich;
    int mod = fmod;
#if 0
    post("mouseup %d %d %d %d", xpos, ypos, which, mod);
#endif
    if (!x->gl_editor)
    {
        bug("editor");
        return;
    }

    EDITOR->canvas_upclicktime = sys_getrealtime();
    EDITOR->canvas_upx = xpos;
    EDITOR->canvas_upy = ypos;

    if (x->gl_editor->e_onmotion == MA_CONNECT)
        canvas_doconnect(x, xpos, ypos, mod, 1);
    else if (x->gl_editor->e_onmotion == MA_REGION)
        canvas_doregion(x, xpos, ypos, 1);
    else if ((x->gl_editor->e_onmotion == MA_MOVE ||
              x->gl_editor->e_onmotion == MA_RESIZE))
    {
            /* if there's only one text item selected activate the text.
            LATER consider under sme conditions not activating it, for instance
            if it appears to have been desired only to move the object.  Maybe
            shift-click could allow dragging without activating text?  A
            different solution (only activating if the object wasn't moved
            (commit f0df4e586) turned out to flout ctrlD+move+retype. */
        if (x->gl_editor->e_selection &&
            !(x->gl_editor->e_selection->sel_next))
        {
            t_gobj *g = x->gl_editor->e_selection->sel_what;
            t_glist *gl2;
                /* first though, check we aren't an abstraction with a
                   dirty sub-patch that would be discarded if we edit this. */
            if (canvas_undo_confirmdiscard(g))
                return;
                /* OK, activate it */
            gobj_activate(x->gl_editor->e_selection->sel_what, x, 1);
        }
    }
    else if (x->gl_editor->e_onmotion == MA_PASSOUT)
    {
        if (!x->gl_editor->e_motionfn)
            bug("e_motionfn");
        (*x->gl_editor->e_motionfn)(&x->gl_editor->e_grab->g_pd,
            xpos - x->gl_editor->e_xwas, ypos - x->gl_editor->e_ywas, 1);
    }
    x->gl_editor->e_onmotion = MA_NONE;
}